

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_setupresult(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  Reg dest;
  int32_t ofs;
  int hiop;
  RegSet drop;
  CCallInfo *ci_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  ofs = -0xf039;
  bVar3 = false;
  if (*(char *)((long)ir + 0xd) == '\x10') {
    bVar3 = (*(byte *)((long)ir + 0xc) & 0x1f) != 0;
  }
  if ((ci->flags & 0x400) != 0) {
    ofs = 0xfc7;
  }
  if (((ir->field_1).r & 0x80) == 0) {
    ofs = (1 << ((ir->field_1).r & 0x1f) ^ 0xffffffffU) & ofs;
  }
  if ((bVar3) && ((*(byte *)((long)ir + 0xe) & 0x80) == 0)) {
    ofs = (1 << (*(byte *)((long)ir + 0xe) & 0x1f) ^ 0xffffffffU) & ofs;
  }
  ra_evictset(as,ofs);
  if ((((ir->field_1).r & 0x80) == 0) || ((ir->field_1).s != '\0')) {
    if ((((ir->field_1).t.irt & 0x1f) == 0xe) || (((ir->field_1).t.irt & 0x1f) == 0xd)) {
      bVar1 = (ir->field_1).s;
      if ((ci->flags & 0x200) == 0) {
        ra_destreg(as,ir,0x10);
      }
      else {
        bVar2 = (ir->field_1).r;
        if ((bVar2 & 0x80) == 0) {
          as->freeset = 1 << (bVar2 & 0x1f) | as->freeset;
          as->modset = 1 << (bVar2 & 0x1f) | as->modset;
          emit_rr(as,XO_MOVD,bVar2 | 0x80200,0);
        }
        if (bVar1 != 0) {
          emit_rmro(as,XO_MOVto,0x80200,4,(uint)bVar1 << 2);
        }
      }
    }
    else if (bVar3) {
      ra_destpair(as,ir);
    }
    else {
      ra_destreg(as,ir,0);
    }
  }
  return;
}

Assistant:

static void asm_setupresult(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  RegSet drop = RSET_SCRATCH;
  int hiop = ((ir+1)->o == IR_HIOP && !irt_isnil((ir+1)->t));
  if ((ci->flags & CCI_NOFPRCLOBBER))
    drop &= ~RSET_FPR;
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  if (hiop && ra_hasreg((ir+1)->r))
    rset_clear(drop, (ir+1)->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);  /* Evictions must be performed first. */
  if (ra_used(ir)) {
    if (irt_isfp(ir->t)) {
      int32_t ofs = sps_scale(ir->s);  /* Use spill slot or temp slots. */
#if LJ_64
      if ((ci->flags & CCI_CASTU64)) {
	Reg dest = ir->r;
	if (ra_hasreg(dest)) {
	  ra_free(as, dest);
	  ra_modified(as, dest);
	  emit_rr(as, XO_MOVD, dest|REX_64, RID_RET);  /* Really MOVQ. */
	}
	if (ofs) emit_movtomro(as, RID_RET|REX_64, RID_ESP, ofs);
      } else {
	ra_destreg(as, ir, RID_FPRET);
      }
#else
      /* Number result is in x87 st0 for x86 calling convention. */
      Reg dest = ir->r;
      if (ra_hasreg(dest)) {
	ra_free(as, dest);
	ra_modified(as, dest);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSD : XO_MOVSS,
		  dest, RID_ESP, ofs);
      }
      if ((ci->flags & CCI_CASTU64)) {
	emit_movtomro(as, RID_RETLO, RID_ESP, ofs);
	emit_movtomro(as, RID_RETHI, RID_ESP, ofs+4);
      } else {
	emit_rmro(as, irt_isnum(ir->t) ? XO_FSTPq : XO_FSTPd,
		  irt_isnum(ir->t) ? XOg_FSTPq : XOg_FSTPd, RID_ESP, ofs);
      }
#endif
    } else if (hiop) {
      ra_destpair(as, ir);
    } else {
      lj_assertA(!irt_ispri(ir->t), "PRI dest");
      ra_destreg(as, ir, RID_RET);
    }
  } else if (LJ_32 && irt_isfp(ir->t) && !(ci->flags & CCI_CASTU64)) {
    emit_x87op(as, XI_FPOP);  /* Pop unused result from x87 st0. */
  }
}